

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_delay.cpp
# Opt level: O0

void __thiscall tst_qpromise_delay::fulfilledStdChrono(tst_qpromise_delay *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  anon_class_16_2_30a9d772 handler;
  bool local_a2;
  bool local_a1 [5];
  int local_9c;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *local_98;
  qint64 *local_90;
  int local_74;
  duration<long,_std::ratio<1L,_1L>_> local_70;
  duration<long,std::ratio<1l,1000l>> local_68 [12];
  int local_5c;
  QPromise<int> local_58;
  QPromiseBase<int> local_48;
  undefined1 local_38 [8];
  QPromise<int> p;
  qint64 elapsed;
  QElapsedTimer timer;
  tst_qpromise_delay *this_local;
  
  timer.t2 = (qint64)this;
  QElapsedTimer::QElapsedTimer((QElapsedTimer *)&elapsed);
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0xffffffffffffffff;
  QElapsedTimer::start();
  local_5c = 0x2a;
  QtPromise::QPromise<int>::resolve(&local_58,&local_5c);
  local_74 = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_70,&local_74);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            (local_68,&local_70);
  QtPromise::QPromiseBase<int>::delay(&local_48,(milliseconds)&local_58);
  local_98 = &p.super_QPromiseBase<int>.m_d;
  local_90 = &elapsed;
  handler.timer = (QElapsedTimer *)local_98;
  handler.elapsed = (qint64 *)&local_48;
  QtPromise::QPromiseBase<int>::finally<tst_qpromise_delay::fulfilledStdChrono()::__0>
            ((QPromiseBase<int> *)local_38,handler);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_48);
  QtPromise::QPromise<int>::~QPromise(&local_58);
  local_9c = -1;
  iVar3 = waitForValue<int>((QPromise<int> *)local_38,&local_9c);
  bVar1 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                          ,0x4e);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_a1[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_38);
    local_a2 = true;
    bVar2 = QTest::qCompare<bool,bool>
                      (local_a1,&local_a2,"p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                       ,0x4f);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar1 = QTest::qVerify(0x3ab < (long)p.super_QPromiseBase<int>.m_d.d,
                             "elapsed >= static_cast<qint64>(1000 * 0.94)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                             ,0x54);
      if ((bVar1 & 1) == 0) {
        local_a1[1] = true;
        local_a1[2] = false;
        local_a1[3] = false;
        local_a1[4] = false;
      }
      else {
        bVar1 = QTest::qVerify((long)p.super_QPromiseBase<int>.m_d.d < 0x425,
                               "elapsed <= static_cast<qint64>(1000 * 1.06)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                               ,0x55);
        if ((bVar1 & 1) == 0) {
          local_a1[1] = true;
          local_a1[2] = false;
          local_a1[3] = false;
          local_a1[4] = false;
        }
        else {
          local_a1[1] = false;
          local_a1[2] = false;
          local_a1[3] = false;
          local_a1[4] = false;
        }
      }
    }
    else {
      local_a1[1] = true;
      local_a1[2] = false;
      local_a1[3] = false;
      local_a1[4] = false;
    }
  }
  else {
    local_a1[1] = true;
    local_a1[2] = false;
    local_a1[3] = false;
    local_a1[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  return;
}

Assistant:

void tst_qpromise_delay::fulfilledStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>::resolve(42).delay(std::chrono::seconds{1}).finally([&]() {
        elapsed = timer.elapsed();
    });

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(1000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(1000 * 1.06));
}